

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O3

string * __thiscall
pbrt::TriQuadMesh::ToString_abi_cxx11_(string *__return_storage_ptr__,TriQuadMesh *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::
  stringPrintfRecursive<std::vector<pbrt::Point3<float>,std::allocator<pbrt::Point3<float>>>const&,std::vector<pbrt::Normal3<float>,std::allocator<pbrt::Normal3<float>>>const&,std::vector<pbrt::Point2<float>,std::allocator<pbrt::Point2<float>>>const&,std::vector<int,std::allocator<int>>const&,std::vector<int,std::allocator<int>>const&,std::vector<int,std::allocator<int>>const&>
            (__return_storage_ptr__,
             "[ TriQuadMesh p: %s n: %s uv: %s faceIndices: %s triIndices: %s quadIndices: %s ]",
             &this->p,&this->n,&this->uv,&this->faceIndices,&this->triIndices,&this->quadIndices);
  return __return_storage_ptr__;
}

Assistant:

std::string TriQuadMesh::ToString() const {
    return StringPrintf("[ TriQuadMesh p: %s n: %s uv: %s faceIndices: %s triIndices: %s "
                        "quadIndices: %s ]",
                        p, n, uv, faceIndices, triIndices, quadIndices);
}